

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O3

bool __thiscall
sparse_square_matrix<bool>::get(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j)

{
  _Bit_type *p_Var1;
  uint uVar2;
  const_iterator cVar3;
  undefined1 uVar4;
  ulong local_10;
  
  uVar2 = this->N;
  if (uVar2 <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
  }
  if (j < uVar2) {
    p_Var1 = (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if ((p_Var1 == (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
       ((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
      local_10 = (ulong)(uVar2 * i + j);
      cVar3 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->sparseStorage)._M_h,&local_10);
      if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>._M_cur ==
          (__node_type *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined1 *)
                 ((long)cVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>
                        ._M_cur + 0x10);
      }
    }
    else {
      uVar2 = uVar2 * i + j;
      uVar4 = (p_Var1[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0;
    }
    return (bool)uVar4;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x3a,
                "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }